

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topten.c
# Opt level: O0

void topten_level_name(int dnum,int dlev,char *outbuf)

{
  char *pcVar1;
  char *local_28;
  char *fmt;
  char *arg;
  char *outbuf_local;
  int dlev_local;
  int dnum_local;
  
  if (dnum == dungeon_topology.d_astral_level.dnum) {
    local_28 = "on the Plane of %s";
    switch(dlev) {
    case -5:
      local_28 = "on the %s Plane";
      fmt = "Astral";
      break;
    case -4:
      fmt = "Water";
      break;
    case -3:
      fmt = "Fire";
      break;
    case -2:
      fmt = "Air";
      break;
    case -1:
      fmt = "Earth";
      break;
    default:
      fmt = "Void";
    }
    pcVar1 = eos(outbuf);
    sprintf(pcVar1,local_28,fmt);
  }
  else {
    pcVar1 = eos(outbuf);
    sprintf(pcVar1,"in %s",dungeons + dnum);
    if (dnum != dungeon_topology.d_knox_level.dnum) {
      pcVar1 = eos(outbuf);
      sprintf(pcVar1," on level %d",(ulong)(uint)dlev);
    }
  }
  return;
}

Assistant:

void topten_level_name(int dnum, int dlev, char *outbuf)
{
    if (dnum == astral_level.dnum) {
	const char *arg, *fmt = "on the Plane of %s";

	switch (dlev) {
	case -5:
		fmt = "on the %s Plane";
		arg = "Astral";	break;
	case -4:
		arg = "Water";	break;
	case -3:
		arg = "Fire";	break;
	case -2:
		arg = "Air";	break;
	case -1:
		arg = "Earth";	break;
	default:
		arg = "Void";	break;
	}
	sprintf(eos(outbuf), fmt, arg);
    } else {
	sprintf(eos(outbuf), "in %s", dungeons[dnum].dname);
	if (dnum != knox_level.dnum)
	    sprintf(eos(outbuf), " on level %d", dlev);
    }
}